

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeBeginTrans(Btree *p,int wrflag,int *pSchemaVersion)

{
  int *piVar1;
  ushort uVar2;
  undefined2 uVar3;
  Pgno PVar4;
  BtShared *pBVar5;
  Pager *pPVar6;
  MemPage *pMVar7;
  sqlite3 *psVar8;
  _func_int_void_ptr_int *p_Var9;
  Wal *pWVar10;
  uint uVar11;
  uint uVar12;
  char cVar13;
  u8 uVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  BtLock *pBVar19;
  u16 uVar20;
  Btree *pBVar21;
  u32 uVar22;
  uint uVar23;
  u8 *puVar24;
  uint uVar25;
  uint uVar26;
  Wal *pWVar27;
  undefined1 auVar28 [16];
  int iStack_54;
  Btree *pBStack_50;
  uint *puStack_48;
  u32 *puStack_40;
  MemPage *pMStack_38;
  
  if (((p->sharable == '\0') && (p->inTrans != '\0')) && (wrflag == 0 || p->inTrans != '\x01')) {
    pBVar5 = p->pBt;
    if (pSchemaVersion != (int *)0x0) {
      uVar17 = *(uint *)(pBVar5->pPage1->aData + 0x28);
      *pSchemaVersion =
           uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
    }
    if (wrflag != 0) {
      pPVar6 = pBVar5->pPager;
      iVar16 = p->db->nSavepoint;
      if ((pPVar6->nSavepoint < iVar16) && (pPVar6->useJournal != '\0')) {
        iVar16 = pagerOpenSavepoint(pPVar6,iVar16);
        return iVar16;
      }
    }
    return 0;
  }
  pBVar5 = p->pBt;
  pPVar6 = pBVar5->pPager;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  if ((p->inTrans == '\x02') || (wrflag == 0 && p->inTrans == '\x01')) {
LAB_00134a1b:
    if ((uint *)pSchemaVersion != (uint *)0x0) {
      uVar17 = *(uint *)(pBVar5->pPage1->aData + 0x28);
      *pSchemaVersion =
           uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
    }
    uVar17 = 0;
    if (((wrflag != 0) && (iVar16 = p->db->nSavepoint, pPVar6->nSavepoint < iVar16)) &&
       (pPVar6->useJournal != '\0')) {
      uVar17 = pagerOpenSavepoint(pPVar6,iVar16);
    }
    goto LAB_00134a5d;
  }
  if (((p->db->flags & 0x2000000) != 0) && (pPVar6->readOnly == '\0')) {
    *(byte *)&pBVar5->btsFlags = (byte)pBVar5->btsFlags & 0xfe;
  }
  puStack_48 = (uint *)pSchemaVersion;
  if ((wrflag != 0) && (uVar17 = 8, (pBVar5->btsFlags & 1) != 0)) goto LAB_00134a5d;
  cVar13 = (char)pBVar5->btsFlags;
  if (wrflag == 0) {
    if (cVar13 < '\0') goto LAB_0013438e;
  }
  else if ((cVar13 < '\0') || (pBVar5->inTransaction == '\x02')) {
LAB_0013438e:
    pBVar21 = pBVar5->pWriter;
LAB_00134396:
    uVar17 = 0x106;
    if (pBVar21->db != (sqlite3 *)0x0) goto LAB_00134a5d;
  }
  else if (1 < wrflag) {
    for (pBVar19 = pBVar5->pLock; pBVar19 != (BtLock *)0x0; pBVar19 = pBVar19->pNext) {
      pBVar21 = pBVar19->pBtree;
      if (pBVar21 != p) goto LAB_00134396;
    }
  }
  uVar17 = querySharedCacheTableLock(p,1,'\x01');
  if (uVar17 == 0) {
    uVar2 = pBVar5->btsFlags;
    pBVar5->btsFlags = uVar2 & 0xffef;
    if (pBVar5->nPage == 0) {
      pBVar5->btsFlags = uVar2 | 0x10;
    }
    puStack_40 = &pBVar5->pageSize;
    uVar17 = 0;
    pBStack_50 = p;
    do {
      if (pBVar5->pPage1 == (MemPage *)0x0) {
        do {
          uVar17 = sqlite3PagerSharedLock(pBVar5->pPager);
          if ((uVar17 != 0) ||
             (uVar17 = btreeGetPage(pBVar5,1,&pMStack_38,0), pMVar7 = pMStack_38, uVar17 != 0))
          goto LAB_00134877;
          puVar24 = pMStack_38->aData;
          uVar17 = *(uint *)(puVar24 + 0x1c);
          uVar23 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                   uVar17 << 0x18;
          uVar18 = pBVar5->pPager->dbSize;
          if ((uVar23 == 0) || (*(int *)(puVar24 + 0x18) != *(int *)(puVar24 + 0x5c))) {
            uVar23 = uVar18;
          }
          if (((pBVar5->db->flags & 0x2000000) == 0) && (uVar23 != 0)) {
            auVar28[0] = -(*puVar24 == 'S');
            auVar28[1] = -(puVar24[1] == 'Q');
            auVar28[2] = -(puVar24[2] == 'L');
            auVar28[3] = -(puVar24[3] == 'i');
            auVar28[4] = -(puVar24[4] == 't');
            auVar28[5] = -(puVar24[5] == 'e');
            auVar28[6] = -(puVar24[6] == ' ');
            auVar28[7] = -(puVar24[7] == 'f');
            auVar28[8] = -(puVar24[8] == 'o');
            auVar28[9] = -(puVar24[9] == 'r');
            auVar28[10] = -(puVar24[10] == 'm');
            auVar28[0xb] = -(puVar24[0xb] == 'a');
            auVar28[0xc] = -(puVar24[0xc] == 't');
            auVar28[0xd] = -(puVar24[0xd] == ' ');
            auVar28[0xe] = -(puVar24[0xe] == '3');
            auVar28[0xf] = -(puVar24[0xf] == '\0');
            uVar25 = 0x1a;
            uVar17 = uVar25;
            if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar28[0xf] >> 7) << 0xf) == 0xffff) {
              if (2 < puVar24[0x12]) {
                *(byte *)&pBVar5->btsFlags = (byte)pBVar5->btsFlags | 1;
              }
              if (puVar24[0x13] < 3) {
                if ((puVar24[0x13] == 2) && ((pBVar5->btsFlags & 0x20) == 0)) {
                  iStack_54 = 0;
                  uVar17 = sqlite3PagerOpenWal(pBVar5->pPager,&iStack_54);
                  if (uVar17 == 0) {
                    if (iStack_54 != 0) goto LAB_00134551;
                    releasePageOne((MemPage *)pMVar7->pDbPage);
                    goto LAB_001346ef;
                  }
                }
                else {
LAB_00134551:
                  uVar17 = uVar25;
                  if (puVar24[0x17] == ' ' && *(short *)(puVar24 + 0x15) == 0x2040) {
                    uVar12 = (uint)puVar24[0x10] * 0x100;
                    uVar11 = (uint)puVar24[0x11] * 0x10000;
                    if ((0xffff00ff < (uVar11 + uVar12) - 0x10001) &&
                       (uVar26 = uVar11 | uVar12, ((uVar12 + uVar11) - 1 & uVar26) == 0)) {
                      bVar15 = puVar24[0x14];
                      uVar22 = uVar26 - bVar15;
                      if (uVar26 != *puStack_40) {
                        releasePageOne((MemPage *)pMVar7->pDbPage);
                        pBVar5->usableSize = uVar22;
                        pBVar5->pageSize = uVar26;
                        *(byte *)&pBVar5->btsFlags = (byte)pBVar5->btsFlags | 2;
                        if (pBVar5->pTmpSpace != (u8 *)0x0) {
                          puVar24 = pBVar5->pTmpSpace + -4;
                          pBVar5->pTmpSpace = puVar24;
                          pcache1Free(puVar24);
                          pBVar5->pTmpSpace = (u8 *)0x0;
                        }
                        uVar17 = sqlite3PagerSetPagesize(pBVar5->pPager,puStack_40,(uint)bVar15);
                        if (uVar17 == 0) goto LAB_001346ef;
                        goto LAB_00134877;
                      }
                      if ((uVar18 < uVar23) &&
                         (uVar23 = uVar18, (pBVar5->db->flags & 0x10000001) != 1)) {
                        uVar17 = 0xb;
                        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x120cf,
                                    "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33"
                                   );
                      }
                      else if (0x1df < uVar22) {
                        *(byte *)&pBVar5->btsFlags = (byte)pBVar5->btsFlags | 2;
                        pBVar5->pageSize = uVar26;
                        pBVar5->usableSize = uVar22;
                        uVar17 = *(uint *)(puVar24 + 0x34);
                        pBVar5->autoVacuum =
                             ((uVar17 >> 0x18 != 0 || (uVar17 & 0xff0000) != 0) ||
                             (uVar17 & 0xff00) != 0) || (uVar17 & 0xff) != 0;
                        uVar17 = *(uint *)(puVar24 + 0x40);
                        pBVar5->incrVacuum =
                             ((uVar17 >> 0x18 != 0 || (uVar17 & 0xff0000) != 0) ||
                             (uVar17 & 0xff00) != 0) || (uVar17 & 0xff) != 0;
                        goto LAB_0013461d;
                      }
                    }
                  }
                }
              }
            }
            releasePageOne((MemPage *)pMVar7->pDbPage);
            pBVar5->pPage1 = (MemPage *)0x0;
            goto LAB_00134877;
          }
          uVar22 = pBVar5->usableSize;
          uVar23 = 0;
LAB_0013461d:
          iVar16 = (uVar22 * 0x40 - 0x300) / 0xff - 0x17;
          pBVar5->maxLocal = (ushort)iVar16;
          uVar20 = (short)((uVar22 * 0x20 - 0x180) / 0xff) - 0x17;
          pBVar5->minLocal = uVar20;
          pBVar5->maxLeaf = (short)uVar22 - 0x23;
          pBVar5->minLeaf = uVar20;
          if (0x7e < (ushort)iVar16) {
            iVar16 = 0x7f;
          }
          pBVar5->max1bytePayload = (u8)iVar16;
          pBVar5->pPage1 = pMVar7;
          pBVar5->nPage = uVar23;
LAB_001346ef:
        } while (pBVar5->pPage1 == (MemPage *)0x0);
        uVar17 = 0;
      }
      if ((wrflag == 0) || (uVar17 != 0)) {
LAB_0013481b:
        p = pBStack_50;
        if (uVar17 == 0) {
          if ((pBStack_50->inTrans == '\0') &&
             (pBVar5->nTransaction = pBVar5->nTransaction + 1, pBStack_50->sharable != '\0')) {
            (pBStack_50->lock).eLock = '\x01';
            (pBStack_50->lock).pNext = pBVar5->pLock;
            pBVar5->pLock = &pBStack_50->lock;
          }
          bVar15 = 2 - (wrflag == 0);
          pBStack_50->inTrans = bVar15;
          if (pBVar5->inTransaction < bVar15) {
            pBVar5->inTransaction = bVar15;
          }
          pSchemaVersion = (int *)puStack_48;
          if (wrflag == 0) goto LAB_00134a1b;
          pMVar7 = pBVar5->pPage1;
          pBVar5->pWriter = pBStack_50;
          uVar3 = pBVar5->btsFlags;
          pBVar5->btsFlags = (ushort)(1 < wrflag) << 6 | uVar3 & 0xffbf;
          uVar17 = *(uint *)(pMVar7->aData + 0x1c);
          if (pBVar5->nPage ==
              (uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18))
          goto LAB_00134a1b;
          uVar17 = sqlite3PagerWrite(pMVar7->pDbPage);
          if (uVar17 != 0) break;
          uVar17 = pBVar5->nPage;
          *(uint *)(pMVar7->aData + 0x1c) =
               uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
          pSchemaVersion = (int *)puStack_48;
          goto LAB_00134a1b;
        }
LAB_00134877:
        uVar14 = pBVar5->inTransaction;
      }
      else {
        uVar17 = 8;
        if ((pBVar5->btsFlags & 1) != 0) goto LAB_00134877;
        uVar18 = pPVar6->errCode;
        if (uVar18 == 0) {
          pPVar6->subjInMemory = pBStack_50->db->temp_store == '\x02';
          if (pPVar6->eState != '\x01') {
LAB_00134810:
            uVar17 = newDatabase(pBVar5);
            goto LAB_0013481b;
          }
          pWVar27 = pPVar6->pWal;
          if (pWVar27 == (Wal *)0x0) {
            uVar18 = pagerLockDb(pPVar6,2);
            if (uVar18 != 0 || wrflag < 2) {
LAB_001347eb:
              if (uVar18 != 0) goto LAB_00134434;
LAB_001347f3:
              pPVar6->eState = '\x02';
              PVar4 = pPVar6->dbSize;
              pPVar6->dbHintSize = PVar4;
              pPVar6->dbFileSize = PVar4;
              pPVar6->dbOrigSize = PVar4;
              pPVar6->journalOff = 0;
              goto LAB_00134810;
            }
            do {
              uVar18 = pagerLockDb(pPVar6,4);
              if (uVar18 != 5) goto LAB_001347eb;
              iVar16 = (*pPVar6->xBusyHandler)(pPVar6->pBusyHandlerArg);
              uVar17 = 5;
            } while (iVar16 != 0);
          }
          else {
            if ((pPVar6->exclusiveMode != '\0') && (pWVar27->exclusiveMode == '\0')) {
              uVar18 = pagerLockDb(pPVar6,4);
              if (uVar18 != 0) goto LAB_00134434;
              pWVar10 = pPVar6->pWal;
              pWVar27 = pWVar10;
              if (pWVar10->exclusiveMode == '\0') {
                (*pWVar10->pDbFd->pMethods->xShmLock)(pWVar10->pDbFd,pWVar10->readLock + 3,1,5);
                pWVar27 = pPVar6->pWal;
              }
              pWVar10->exclusiveMode = '\x01';
            }
            if (pWVar27->readOnly == '\0') {
              if ((pWVar27->exclusiveMode == '\0') &&
                 (uVar18 = (*pWVar27->pDbFd->pMethods->xShmLock)(pWVar27->pDbFd,0,1,10), uVar18 != 0
                 )) goto LAB_00134434;
              pWVar27->writeLock = '\x01';
              iVar16 = bcmp(&pWVar27->hdr,*pWVar27->apWiData,0x30);
              if (iVar16 == 0) goto LAB_001347f3;
              if (pWVar27->exclusiveMode == '\0') {
                (*pWVar27->pDbFd->pMethods->xShmLock)(pWVar27->pDbFd,0,1,9);
              }
              pWVar27->writeLock = '\0';
              goto LAB_00134442;
            }
          }
          goto LAB_00134877;
        }
LAB_00134434:
        uVar17 = uVar18;
        if (uVar18 != 0x205) goto LAB_00134877;
LAB_00134442:
        uVar14 = pBVar5->inTransaction;
        uVar17 = (uint)(uVar14 != '\0') << 9 | 5;
      }
      if ((uVar14 == '\0') && (pMVar7 = pBVar5->pPage1, pMVar7 != (MemPage *)0x0)) {
        pBVar5->pPage1 = (MemPage *)0x0;
        releasePageOne((MemPage *)pMVar7->pDbPage);
      }
      p = pBStack_50;
      if (((char)uVar17 != '\x05') || (pBVar5->inTransaction != '\0')) break;
      psVar8 = pBVar5->db;
      p_Var9 = (psVar8->busyHandler).xBusyHandler;
      if ((p_Var9 == (_func_int_void_ptr_int *)0x0) ||
         (iVar16 = (psVar8->busyHandler).nBusy, iVar16 < 0)) break;
      iVar16 = (*p_Var9)((psVar8->busyHandler).pBusyArg,iVar16);
      if (iVar16 == 0) goto LAB_00134965;
      piVar1 = &(psVar8->busyHandler).nBusy;
      *piVar1 = *piVar1 + 1;
    } while( true );
  }
LAB_00134a5d:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return uVar17;
LAB_00134965:
  (psVar8->busyHandler).nBusy = -1;
  goto LAB_00134a5d;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeBeginTrans(Btree *p, int wrflag, int *pSchemaVersion){
  BtShared *pBt;
  if( p->sharable
   || p->inTrans==TRANS_NONE
   || (p->inTrans==TRANS_READ && wrflag!=0)
  ){
    return btreeBeginTrans(p,wrflag,pSchemaVersion);
  }
  pBt = p->pBt;
  if( pSchemaVersion ){
    *pSchemaVersion = get4byte(&pBt->pPage1->aData[40]);
  }
  if( wrflag ){
    /* This call makes sure that the pager has the correct number of
    ** open savepoints. If the second parameter is greater than 0 and
    ** the sub-journal is not already open, then it will be opened here.
    */
    return sqlite3PagerOpenSavepoint(pBt->pPager, p->db->nSavepoint);
  }else{
    return SQLITE_OK;
  }
}